

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::DescriptorBuilder
          (DescriptorBuilder *this,DescriptorPool *pool,Tables *tables,
          ErrorCollector *error_collector)

{
  _Rb_tree_header *p_Var1;
  
  this->pool_ = pool;
  this->tables_ = tables;
  this->error_collector_ = error_collector;
  (this->options_to_interpret_).
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options_to_interpret_).
  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->options_to_interpret_).
           super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->options_to_interpret_).
           super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
  (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header;
  (this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->unused_dependency_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  (this->possible_undeclared_dependency_name_)._M_dataplus._M_p =
       (pointer)&(this->possible_undeclared_dependency_name_).field_2;
  (this->possible_undeclared_dependency_name_)._M_string_length = 0;
  (this->possible_undeclared_dependency_name_).field_2._M_local_buf[0] = '\0';
  (this->undefine_resolved_name_)._M_dataplus._M_p =
       (pointer)&(this->undefine_resolved_name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->undefine_resolved_name_,anon_var_dwarf_3e5733 + 0x11);
  return;
}

Assistant:

DescriptorBuilder::DescriptorBuilder(
    const DescriptorPool* pool, DescriptorPool::Tables* tables,
    DescriptorPool::ErrorCollector* error_collector)
    : pool_(pool),
      tables_(tables),
      error_collector_(error_collector),
      had_errors_(false),
      possible_undeclared_dependency_(nullptr),
      undefine_resolved_name_("") {}